

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

BVHNodeRecordMB4D<embree::NodeRefPtr<4>_> * __thiscall
embree::sse2::BVHBuilderMSMBlur::
build<embree::NodeRefPtr<4>,embree::sse2::RecalculatePrimRef<embree::QuadMesh>,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::CreateMSMBlurLeaf<4,embree::QuadMesh,embree::QuadMi<4>>,embree::Scene::BuildProgressMonitorInterface>
          (NodeRecordMB4D *__return_storage_ptr__,BVHBuilderMSMBlur *this,undefined8 *prims,
          undefined8 pinfo,undefined8 device,undefined8 recalculatePrimRef,undefined8 createAlloc,
          long param_8,undefined8 param_9)

{
  CachedAllocator alloc;
  NodeRecordMB4D *ret;
  Builder builder;
  undefined **local_170;
  undefined8 local_168;
  BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
  local_160;
  BuildRecord local_d8;
  
  local_170 = &PTR_operator___02202970;
  local_168 = *(undefined8 *)(param_8 + 8);
  BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
  ::BuilderT(&local_160,pinfo,device,recalculatePrimRef,createAlloc,&local_170,param_9);
  local_d8.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
  lower.field_0._0_8_ = *prims;
  local_d8.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
  lower.field_0._8_8_ = prims[1];
  local_d8.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
  upper.field_0._0_8_ = prims[2];
  local_d8.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
  upper.field_0._8_8_ = prims[3];
  local_d8.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
  lower.field_0._0_8_ = prims[4];
  local_d8.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
  lower.field_0._8_8_ = prims[5];
  local_d8.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
  upper.field_0._0_8_ = prims[6];
  local_d8.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
  upper.field_0._8_8_ = prims[7];
  local_d8.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
  field_0._0_8_ = prims[8];
  local_d8.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
  field_0._8_8_ = prims[9];
  local_d8.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
  field_0._0_8_ = prims[10];
  local_d8.prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
  field_0._8_8_ = prims[0xb];
  local_d8.prims.super_PrimInfoMB.num_time_segments = prims[0xe];
  local_d8.prims.super_PrimInfoMB.max_num_time_segments = prims[0xf];
  local_d8.prims.super_PrimInfoMB.max_time_range = *(BBox1f *)(prims + 0x10);
  local_d8.prims.super_PrimInfoMB.time_range = *(BBox1f *)(prims + 0x11);
  local_d8.depth = 1;
  local_d8.prims.super_PrimInfoMB.object_range._begin = prims[0xc];
  local_d8.prims.super_PrimInfoMB.object_range._end = prims[0xd];
  alloc.talloc1 = (ThreadLocal *)0x0;
  alloc.alloc = (FastAllocator *)0x0;
  alloc.talloc0 = (ThreadLocal *)0x0;
  local_d8.prims.prims = (PrimRefVector)this;
  BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
  ::recurse(__return_storage_ptr__,&local_160,&local_d8,alloc,true);
  return __return_storage_ptr__;
}

Assistant:

static const BVHNodeRecordMB4D<NodeRef> build(mvector<PrimRefMB>& prims,
                                                      const PrimInfoMB& pinfo,
                                                      MemoryMonitorInterface* device,
                                                      const RecalculatePrimRef recalculatePrimRef,
                                                      const CreateAllocFunc createAlloc,
                                                      const CreateNodeFunc createNode,
                                                      const SetNodeFunc setNode,
                                                      const CreateLeafFunc createLeaf,
                                                      const ProgressMonitorFunc progressMonitor,
                                                      const Settings& settings)
      {
          typedef BuilderT<
            NodeRef,
            RecalculatePrimRef,
            decltype(createAlloc()),
            CreateAllocFunc,
            CreateNodeFunc,
            SetNodeFunc,
            CreateLeafFunc,
            ProgressMonitorFunc> Builder;

          Builder builder(device,
                          recalculatePrimRef,
                          createAlloc,
                          createNode,
                          setNode,
                          createLeaf,
                          progressMonitor,
                          settings);


          return builder(prims,pinfo);
        }